

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1253::run(TestCase1253 *this)

{
  word **this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  __off_t __length;
  BuilderFor<capnp::Data> BVar5;
  ArrayPtr<const_unsigned_char> AVar6;
  ArrayPtr<const_unsigned_char> local_250;
  int local_240;
  bool local_239;
  undefined1 auStack_238 [7];
  bool _kj_shouldLog_5;
  size_t local_230;
  uint local_224 [2];
  bool local_219;
  uint local_218;
  int iStack_214;
  bool _kj_shouldLog_4;
  bool local_20d;
  uint local_20c;
  uint uStack_208;
  bool _kj_shouldLog_3;
  uint i_2;
  bool local_1fd;
  uint local_1fc;
  uint uStack_1f8;
  bool _kj_shouldLog_2;
  bool local_1f1;
  uint local_1f0;
  uint uStack_1ec;
  bool _kj_shouldLog_1;
  uint i_1;
  bool local_1e1;
  undefined1 local_1e0 [7];
  bool _kj_shouldLog;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  Orphanage local_1a0;
  undefined1 local_190 [8];
  Orphan<capnp::Data> orphan2;
  undefined1 local_168 [4];
  uint i;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  MallocMessageBuilder message;
  TestCase1253 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,&local_130,7);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get
            ((BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_168,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  for (orphan2.builder.location._4_4_ = 0; orphan2.builder.location._4_4_ < 7;
      orphan2.builder.location._4_4_ = orphan2.builder.location._4_4_ + 1) {
    List<unsigned_int,_(capnp::Kind)0>::Builder::set
              ((Builder *)local_168,orphan2.builder.location._4_4_,
               orphan2.builder.location._4_4_ + 0x75bcd15);
  }
  local_1a0 = MessageBuilder::getOrphanage((MessageBuilder *)&orphan.builder.location);
  Orphanage::newOrphan<capnp::Data>((Orphan<capnp::Data> *)local_190,&local_1a0,1);
  BVar5 = Orphan<capnp::Data>::get((Orphan<capnp::Data> *)local_190);
  reader.reader._40_8_ = BVar5.super_ArrayPtr<unsigned_char>.ptr;
  puVar4 = kj::ArrayPtr<unsigned_char>::operator[]
                     ((ArrayPtr<unsigned_char> *)&reader.reader.nestingLimit,0);
  *puVar4 = ' ';
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::truncate
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120,(char *)0xb,__length);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_1e0,
             (Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  uVar1 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_1e0);
  if (uVar1 != 0xb) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      i_1 = 0xb;
      uStack_1ec = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_1e0);
      kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f3,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()"
                 ,(char (*) [41])"failed: expected (11) == (reader.size())",(int *)&i_1,
                 &stack0xfffffffffffffe14);
      local_1e1 = false;
    }
  }
  for (local_1f0 = 0; local_1f0 < 7; local_1f0 = local_1f0 + 1) {
    uVar2 = local_1f0 + 0x75bcd15;
    uVar3 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_1e0,local_1f0);
    if (uVar2 != uVar3) {
      local_1f1 = kj::_::Debug::shouldLog(ERROR);
      while (local_1f1 != false) {
        uStack_1f8 = local_1f0 + 0x75bcd15;
        local_1fc = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                              ((Reader *)local_1e0,local_1f0);
        kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4f6,ERROR,
                   "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                   ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",
                   &stack0xfffffffffffffe08,&local_1fc);
        local_1f1 = false;
      }
    }
    uVar2 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]((Builder *)local_168,local_1f0);
    if (uVar2 != 0) {
      local_1fd = kj::_::Debug::shouldLog(ERROR);
      while (local_1fd != false) {
        i_2 = 0;
        uStack_208 = List<unsigned_int,_(capnp::Kind)0>::Builder::operator[]
                               ((Builder *)local_168,local_1f0);
        kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4f7,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                   (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&i_2,
                   &stack0xfffffffffffffdf8);
        local_1fd = false;
      }
    }
  }
  for (local_20c = 7; local_20c < 0xb; local_20c = local_20c + 1) {
    uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_1e0,local_20c);
    if (uVar2 != 0) {
      local_20d = kj::_::Debug::shouldLog(ERROR);
      while (local_20d != false) {
        iStack_214 = 0;
        local_218 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]
                              ((Reader *)local_1e0,local_20c);
        kj::_::Debug::log<char_const(&)[36],int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x4fa,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                   (char (*) [36])"failed: expected (0) == (reader[i])",&stack0xfffffffffffffdec,
                   &local_218);
        local_20d = false;
      }
    }
  }
  List<unsigned_int,_(capnp::Kind)0>::Builder::set((Builder *)local_168,0,0x141);
  uVar2 = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_1e0,0);
  if (uVar2 != 0x75bcd15) {
    local_219 = kj::_::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      local_224[1] = 0x75bcd15;
      local_224[0] = List<unsigned_int,_(capnp::Kind)0>::Reader::operator[]((Reader *)local_1e0,0);
      kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x500,ERROR,
                 "\"failed: expected \" \"(123456789) == (reader[0])\", 123456789, reader[0]",
                 (char (*) [44])"failed: expected (123456789) == (reader[0])",(int *)(local_224 + 1)
                 ,local_224);
      local_219 = false;
    }
  }
  _auStack_238 = (ArrayPtr<const_unsigned_char>)
                 Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_190);
  puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[]
                     ((ArrayPtr<const_unsigned_char> *)auStack_238,0);
  if (*puVar4 != ' ') {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      local_240 = 0x20;
      AVar6 = (ArrayPtr<const_unsigned_char>)
              Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_190);
      local_250 = AVar6;
      puVar4 = kj::ArrayPtr<const_unsigned_char>::operator[](&local_250,0);
      kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x502,ERROR,
                 "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
                 ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",&local_240,
                 puVar4);
      local_239 = false;
    }
  }
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_190);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveListCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(123456789, reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}